

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_5c268::MapDriver::bodyInsidePath(MapDriver *this)

{
  PolylineSegmentedPathwaySegmentRadii *pPVar1;
  bool bVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar3;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float in_XMM1_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec3 local_50;
  Vec3 local_40;
  Vec3 local_30;
  Vec3 local_20;
  
  bVar2 = true;
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[2])();
    fVar9 = this->halfWidth;
    in_XMM1_Da = in_XMM1_Da * fVar9;
    fVar4 = in_XMM1_Da;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[6])(this);
    fVar7 = this->halfLength;
    fVar8 = fVar9 * extraout_XMM0_Da;
    fVar9 = fVar9 * extraout_XMM0_Db;
    fVar4 = fVar4 * fVar7;
    fVar6 = fVar7 * extraout_XMM0_Da_00;
    fVar7 = fVar7 * extraout_XMM0_Db_00;
    pPVar1 = this->path;
    fVar3 = fVar4;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    local_20.z = (fVar3 - fVar4) + in_XMM1_Da;
    local_20.y = (extraout_XMM0_Db_01 - fVar7) + fVar9;
    local_20.x = (extraout_XMM0_Da_01 - fVar6) + fVar8;
    fVar3 = mapPointToOutside(pPVar1,&local_20);
    fVar5 = 0.0;
    if (fVar3 < 0.0) {
      pPVar1 = this->path;
      (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      local_30.z = fVar5 + fVar4 + in_XMM1_Da;
      local_30.y = extraout_XMM0_Db_02 + fVar7 + fVar9;
      local_30.x = extraout_XMM0_Da_02 + fVar6 + fVar8;
      fVar3 = mapPointToOutside(pPVar1,&local_30);
      fVar5 = 0.0;
      if (fVar3 < 0.0) {
        pPVar1 = this->path;
        (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
          super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
          super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
        local_40.z = (fVar5 + fVar4) - in_XMM1_Da;
        local_40.y = (extraout_XMM0_Db_03 + fVar7) - fVar9;
        local_40.x = (extraout_XMM0_Da_03 + fVar6) - fVar8;
        fVar3 = mapPointToOutside(pPVar1,&local_40);
        fVar5 = 0.0;
        if (fVar3 < 0.0) {
          pPVar1 = this->path;
          (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
            super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
            super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
          local_50.z = (fVar5 - fVar4) - in_XMM1_Da;
          local_50.y = (extraout_XMM0_Db_04 - fVar7) - fVar9;
          local_50.x = (extraout_XMM0_Da_04 - fVar6) - fVar8;
          fVar9 = mapPointToOutside(pPVar1,&local_50);
          return fVar9 < 0.0;
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool bodyInsidePath (void)
        {
            if (demoSelect == 2)
            {
                const Vec3 bbSide = side () * halfWidth;
                const Vec3 bbFront = forward () * halfLength;
                return ( /* path->isInsidePath (position () - bbFront + bbSide) */ isInsidePathway( *path, position () - bbFront + bbSide ) &&
                         /* path->isInsidePath (position () + bbFront + bbSide) */ isInsidePathway( *path, position () + bbFront + bbSide ) &&
                         /* path->isInsidePath (position () + bbFront - bbSide) */ isInsidePathway( *path, position () + bbFront - bbSide ) &&
                         /* path->isInsidePath (position () - bbFront - bbSide) */ isInsidePathway( *path, position () - bbFront - bbSide ) );
            }
            return true;
        }